

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::BuildXformNodeFromStageRec
               (Stage *stage,Path *parent_abs_path,Prim *prim,XformNode *nodeOut,matrix4d rootMat,
               double t,TimeSampleInterpolationType tinterp)

{
  matrix4d rootMat_00;
  double prim_00;
  byte bVar1;
  bool bVar2;
  string *psVar3;
  bool *pbVar4;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this;
  matrix4d *__src;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  double dStack_910;
  undefined1 local_908 [8];
  XformNode childNode;
  Prim *childPrim;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  matrix4d local_5c0;
  undefined1 local_540 [8];
  matrix4d m;
  matrix4d worldMat;
  matrix4d localMat;
  undefined1 local_3b8 [7];
  bool resetXformStack;
  undefined1 local_2e8 [8];
  XformNode node;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  XformNode *nodeOut_local;
  Prim *prim_local;
  Path *parent_abs_path_local;
  Stage *stage_local;
  
  if (nodeOut == (XformNode *)0x0) {
    stage_local._7_1_ = 0;
  }
  else {
    node._parent_world_matrix.m[3][3]._4_4_ = tinterp;
    XformNode::XformNode((XformNode *)local_2e8);
    Prim::element_name_abi_cxx11_(prim);
    ::std::__cxx11::string::empty();
    psVar3 = Prim::element_name_abi_cxx11_(prim);
    ::std::__cxx11::string::operator=((string *)local_2e8,(string *)psVar3);
    psVar3 = Prim::element_name_abi_cxx11_(prim);
    Path::AppendPrim((Path *)local_3b8,parent_abs_path,psVar3);
    Path::operator=((Path *)((long)&node.element_name.field_2 + 8),(Path *)local_3b8);
    Path::~Path((Path *)local_3b8);
    node.prim = (Prim *)Prim::prim_id(prim);
    node.absolute_path._200_8_ = prim;
    bVar2 = IsXformablePrim(prim);
    if (bVar2) {
      localMat.m[3][3]._7_1_ = 0;
      GetLocalTransform((matrix4d *)(worldMat.m[3] + 3),prim,(bool *)((long)localMat.m[3] + 0x1f),t,
                        node._parent_world_matrix.m[3][3]._4_4_);
      memcpy(m.m[3] + 3,&rootMat,0x80);
      bVar1 = localMat.m[3][3]._7_1_;
      pbVar4 = XformNode::has_resetXformStack((XformNode *)local_2e8);
      *pbVar4 = (bool)(bVar1 & 1);
      tinyusdz::value::matrix4d::matrix4d((matrix4d *)local_540);
      if ((localMat.m[3][3]._7_1_ & 1) == 0) {
        tinyusdz::value::operator*
                  (&local_5c0,(matrix4d *)(worldMat.m[3] + 3),(matrix4d *)(m.m[3] + 3));
        memcpy(local_540,&local_5c0,0x80);
      }
      else {
        memcpy(local_540,worldMat.m[3] + 3,0x80);
      }
      XformNode::set_parent_world_matrix((XformNode *)local_2e8,&rootMat);
      XformNode::set_local_matrix((XformNode *)local_2e8,(matrix4d *)(worldMat.m[3] + 3));
      XformNode::set_world_matrix((XformNode *)local_2e8,(matrix4d *)local_540);
      pbVar4 = XformNode::has_xform((XformNode *)local_2e8);
      *pbVar4 = true;
    }
    else {
      pbVar4 = XformNode::has_xform((XformNode *)local_2e8);
      *pbVar4 = false;
      pbVar4 = XformNode::has_resetXformStack((XformNode *)local_2e8);
      *pbVar4 = false;
      XformNode::set_parent_world_matrix((XformNode *)local_2e8,&rootMat);
      XformNode::set_world_matrix((XformNode *)local_2e8,&rootMat);
      tinyusdz::value::matrix4d::identity();
      XformNode::set_local_matrix((XformNode *)local_2e8,(matrix4d *)&__range2);
    }
    this = Prim::children(prim);
    __end2 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this);
    childPrim = (Prim *)::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                       *)&childPrim), bVar2) {
      childNode._parent_world_matrix.m[3][3] =
           (double)__gnu_cxx::
                   __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                   ::operator*(&__end2);
      XformNode::XformNode((XformNode *)local_908);
      prim_00 = childNode._parent_world_matrix.m[3][3];
      __src = XformNode::get_world_matrix((XformNode *)local_2e8);
      memcpy(&local_988,__src,0x80);
      rootMat_00.m[0][1] = (double)uStack_980;
      rootMat_00.m[0][0] = (double)local_988;
      rootMat_00.m[0][2] = (double)local_978;
      rootMat_00.m[0][3] = (double)uStack_970;
      rootMat_00.m[1][0] = (double)local_968;
      rootMat_00.m[1][1] = (double)uStack_960;
      rootMat_00.m[1][2] = (double)local_958;
      rootMat_00.m[1][3] = (double)uStack_950;
      rootMat_00.m[2][0] = (double)local_948;
      rootMat_00.m[2][1] = (double)uStack_940;
      rootMat_00.m[2][2] = (double)local_938;
      rootMat_00.m[2][3] = (double)uStack_930;
      rootMat_00.m[3][0] = (double)local_928;
      rootMat_00.m[3][1] = (double)uStack_920;
      rootMat_00.m[3][2] = (double)local_918;
      rootMat_00.m[3][3] = dStack_910;
      bVar2 = BuildXformNodeFromStageRec
                        (stage,(Path *)((long)&node.element_name.field_2 + 8),(Prim *)prim_00,
                         (XformNode *)local_908,rootMat_00,t,node._parent_world_matrix.m[3][3]._4_4_
                        );
      if (bVar2) {
        childNode.prim_id = (int64_t)local_2e8;
        ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
        emplace_back<tinyusdz::tydra::XformNode>
                  ((vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>
                    *)&node.parent,(XformNode *)local_908);
      }
      else {
        stage_local._7_1_ = 0;
      }
      XformNode::~XformNode((XformNode *)local_908);
      if (!bVar2) goto LAB_004851ab;
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end2);
    }
    XformNode::operator=(nodeOut,(XformNode *)local_2e8);
    stage_local._7_1_ = 1;
LAB_004851ab:
    XformNode::~XformNode((XformNode *)local_2e8);
  }
  return (bool)(stage_local._7_1_ & 1);
}

Assistant:

bool BuildXformNodeFromStageRec(
    const tinyusdz::Stage &stage, const Path &parent_abs_path, const Prim *prim,
    XformNode *nodeOut, /* out */
    value::matrix4d rootMat, const double t,
    const tinyusdz::value::TimeSampleInterpolationType tinterp) {
  if (!nodeOut) {
    return false;
  }

  XformNode node;

  if (prim->element_name().empty()) {
    // TODO: report error
  }

  node.element_name = prim->element_name();
  node.absolute_path = parent_abs_path.AppendPrim(prim->element_name());
  node.prim_id = prim->prim_id();
  node.prim = prim;  // Assume Prim's address does not change.

  DCOUT(prim->element_name() << ": IsXformablePrim" << IsXformablePrim(*prim));

  if (IsXformablePrim(*prim)) {
    bool resetXformStack{false};

    value::matrix4d localMat =
        GetLocalTransform(*prim, &resetXformStack, t, tinterp);
    DCOUT("local mat = " << localMat);

    value::matrix4d worldMat = rootMat;
    node.has_resetXformStack() = resetXformStack;

    value::matrix4d m;

    if (resetXformStack) {
      // Ignore parent Xform.
      m = localMat;
    } else {
      // matrix is row-major, so local first
      m = localMat * worldMat;
    }

    node.set_parent_world_matrix(rootMat);
    node.set_local_matrix(localMat);
    node.set_world_matrix(m);
    node.has_xform() = true;
  } else {
    DCOUT("Not xformable");
    node.has_xform() = false;
    node.has_resetXformStack() = false;
    node.set_parent_world_matrix(rootMat);
    node.set_world_matrix(rootMat);
    node.set_local_matrix(value::matrix4d::identity());
  }

  for (const auto &childPrim : prim->children()) {
    XformNode childNode;
    if (!BuildXformNodeFromStageRec(stage, node.absolute_path, &childPrim,
                                    &childNode, node.get_world_matrix(), t,
                                    tinterp)) {
      return false;
    }

    childNode.parent = &node;
    node.children.emplace_back(std::move(childNode));
  }

  (*nodeOut) = node;

  return true;
}